

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::run
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          run_cfg rc)

{
  bool bVar1;
  reference pp_Var2;
  _func_void **suite;
  iterator __end4;
  iterator __begin4;
  vector<void_(*)(),_std::allocator<void_(*)()>_> *__range4;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this_local;
  run_cfg rc_local;
  
  this->run_ = true;
  __end4 = std::vector<void_(*)(),_std::allocator<void_(*)()>_>::begin(&this->suites_);
  suite = (_func_void **)std::vector<void_(*)(),_std::allocator<void_(*)()>_>::end(&this->suites_);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
                      (&__end4,(__normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
                                *)&suite);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pp_Var2 = __gnu_cxx::
              __normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
              ::operator*(&__end4);
    (**pp_Var2)();
    __gnu_cxx::__normal_iterator<void_(**)(),_std::vector<void_(*)(),_std::allocator<void_(*)()>_>_>
    ::operator++(&__end4);
  }
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::clear(&this->suites_);
  if ((rc.report_errors & 1U) != 0) {
    reporter<boost::ext::ut::v1_1_8::printer>::on(&this->reporter_);
  }
  return this->fails_ != 0;
}

Assistant:

[[nodiscard]] auto run(run_cfg rc = {}) -> bool {
      run_ = true;
      for (const auto& suite : suites_) {
        suite();
      }
      suites_.clear();

      if (rc.report_errors) {
        reporter_.on(events::summary{});
      }

      return fails_ > 0;
    }